

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  long lVar2;
  _func_int **pp_Var3;
  char cVar4;
  triState tVar5;
  XmlOutput *pXVar6;
  iterator iVar7;
  ulong uVar8;
  ssize_t extraout_RAX;
  XmlOutput *pXVar9;
  int x;
  long lVar10;
  undefined4 in_register_00000034;
  int i;
  int x_1;
  long in_FS_OFFSET;
  XmlOutput xmlFilter;
  QArrayDataPointer<char16_t> local_288;
  QArrayDataPointer<char16_t> local_270;
  xml_output local_258;
  QArrayDataPointer<char16_t> local_220;
  xml_output local_208;
  QArrayDataPointer<char16_t> local_1d0;
  QArrayDataPointer<char16_t> local_1b8;
  xml_output local_1a0;
  xml_output local_168;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_108;
  xml_output local_f0;
  QArrayDataPointer<char16_t> local_b8;
  xml_output local_a0;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  pXVar9 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x100) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      warn_msg(WarnLogic,"Generator: .NET: no single project in merge project, no output");
      return extraout_RAX;
    }
  }
  else {
    QString::QString((QString *)&xmlFilter,"  ");
    XmlOutput::setIndentString(pXVar9,(QString *)&xmlFilter);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&xmlFilter);
    QString::QString((QString *)&local_50,"1.0");
    QString::QString((QString *)&local_68,"utf-8");
    declaration((xml_output *)&xmlFilter,(QString *)&local_50,(QString *)&local_68);
    pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    QString::QString((QString *)&local_b8,"Project");
    tag(&local_a0,(QString *)&local_b8);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
    QString::QString((QString *)&local_108,"DefaultTargets");
    QString::QString((QString *)&local_128,"Build");
    attributeTag(&local_f0,(QString *)&local_108,(QString *)&local_128);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_f0);
    iVar7 = QList<VCProjectSingleConfig>::begin
                      ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0));
    attrTagToolsVersion(&local_168,&(iVar7.i)->Configuration);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_168);
    QString::QString((QString *)&local_1b8,"xmlns");
    QString::QString((QString *)&local_1d0,"http://schemas.microsoft.com/developer/msbuild/2003");
    attributeTag(&local_1a0,(QString *)&local_1b8,(QString *)&local_1d0);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_1a0);
    QString::QString((QString *)&local_220,"ItemGroup");
    tag(&local_208,(QString *)&local_220);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_208);
    QString::QString((QString *)&local_270,"Label");
    QString::QString((QString *)&local_288,"ProjectConfigurations");
    attributeTag(&local_258,(QString *)&local_270,(QString *)&local_288);
    XmlOutput::operator<<(pXVar6,&local_258);
    XmlOutput::xml_output::~xml_output(&local_258);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_270);
    XmlOutput::xml_output::~xml_output(&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_220);
    XmlOutput::xml_output::~xml_output(&local_1a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
    XmlOutput::xml_output::~xml_output(&local_168);
    XmlOutput::xml_output::~xml_output(&local_f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    XmlOutput::xml_output::~xml_output(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    lVar10 = 0x120;
    for (uVar8 = 0; uVar8 < *(ulong *)((long)__buf + 0x100); uVar8 = uVar8 + 1) {
      QString::QString((QString *)&local_208,"ProjectConfiguration");
      tag((xml_output *)&xmlFilter,(QString *)&local_208);
      pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
      QString::QString((QString *)&local_258,"Include");
      attributeTag(&local_a0,(QString *)&local_258,
                   (QString *)(*(long *)((long)__buf + 0xf8) + lVar10));
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
      QString::QString((QString *)&local_50,"Configuration");
      tagValue(&local_f0,(QString *)&local_50,
               (QString *)(*(long *)((long)__buf + 0xf8) + lVar10 + 0x18));
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_f0);
      QString::QString((QString *)&local_68,"Platform");
      tagValue(&local_168,(QString *)&local_68,
               (QString *)(*(long *)((long)__buf + 0xf8) + lVar10 + -0x90));
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_168);
      closetag();
      XmlOutput::operator<<(pXVar6,&local_1a0);
      XmlOutput::xml_output::~xml_output(&local_1a0);
      XmlOutput::xml_output::~xml_output(&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      XmlOutput::xml_output::~xml_output(&local_f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      XmlOutput::xml_output::~xml_output(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_258);
      XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      lVar10 = lVar10 + 0x3a10;
    }
    closetag();
    pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    QString::QString((QString *)&local_258,"PropertyGroup");
    tag(&local_a0,(QString *)&local_258);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
    QString::QString((QString *)&local_50,"Label");
    QString::QString((QString *)&local_68,"Globals");
    attributeTag(&local_f0,(QString *)&local_50,(QString *)&local_68);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_f0);
    QString::QString((QString *)&local_b8,"ProjectGuid");
    tagValue(&local_168,(QString *)&local_b8,(QString *)((long)__buf + 0x30));
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_168);
    QString::QString((QString *)&local_108,"RootNamespace");
    tagValue(&local_1a0,(QString *)&local_108,(QString *)__buf);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_1a0);
    QString::QString((QString *)&local_128,"Keyword");
    tagValue(&local_208,(QString *)&local_128,(QString *)((long)__buf + 0x48));
    XmlOutput::operator<<(pXVar6,&local_208);
    XmlOutput::xml_output::~xml_output(&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    XmlOutput::xml_output::~xml_output(&local_1a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    XmlOutput::xml_output::~xml_output(&local_168);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    XmlOutput::xml_output::~xml_output(&local_f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    XmlOutput::xml_output::~xml_output(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_258);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    if (*(long *)((long)__buf + 0xd0) != 0) {
      QString::QString((QString *)&local_a0,"WindowsTargetPlatformVersion");
      tagValue((xml_output *)&xmlFilter,(QString *)&local_a0,(QString *)((long)__buf + 0xc0));
      XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
      XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    }
    if (*(long *)((long)__buf + 0xe8) != 0) {
      QString::QString((QString *)&local_a0,"WindowsTargetPlatformMinVersion");
      tagValue((xml_output *)&xmlFilter,(QString *)&local_a0,(QString *)((long)__buf + 0xd8));
      XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
      XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    }
    closetag();
    XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    QString::QString((QString *)&local_a0,"Project");
    QString::QString((QString *)&local_f0,"$(VCTargetsPath)\\Microsoft.Cpp.Default.props");
    import((xml_output *)&xmlFilter,(QString *)&local_a0,(QString *)&local_f0);
    XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    lVar10 = 0xc0;
    for (uVar8 = 0; uVar8 < *(ulong *)((long)__buf + 0x100); uVar8 = uVar8 + 1) {
      (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xe])
                (this,pXVar9,*(long *)((long)__buf + 0xf8) + lVar10);
      lVar10 = lVar10 + 0x3a10;
    }
    QString::QString((QString *)&local_a0,"Project");
    QString::QString((QString *)&local_f0,"$(VCTargetsPath)\\Microsoft.Cpp.props");
    import((xml_output *)&xmlFilter,(QString *)&local_a0,(QString *)&local_f0);
    XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    QString::QString((QString *)&local_168,"ImportGroup");
    tag((xml_output *)&xmlFilter,(QString *)&local_168);
    pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    QString::QString((QString *)&local_1a0,"Label");
    QString::QString((QString *)&local_208,"ExtensionSettings");
    attributeTag(&local_a0,(QString *)&local_1a0,(QString *)&local_208);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
    closetag();
    XmlOutput::operator<<(pXVar6,&local_f0);
    XmlOutput::xml_output::~xml_output(&local_f0);
    XmlOutput::xml_output::~xml_output(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    lVar10 = 0xc0;
    for (uVar8 = 0; uVar8 < *(ulong *)((long)__buf + 0x100); uVar8 = uVar8 + 1) {
      QString::QString((QString *)&local_168,"ImportGroup");
      tag((xml_output *)&xmlFilter,(QString *)&local_168);
      pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
      QString::QString((QString *)&local_1a0,"Condition");
      generateCondition((QString *)&local_208,
                        (VCConfiguration *)(*(long *)((long)__buf + 0xf8) + lVar10));
      attributeTag(&local_a0,(QString *)&local_1a0,(QString *)&local_208);
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
      QString::QString((QString *)&local_258,"Label");
      QString::QString((QString *)&local_50,"PropertySheets");
      attributeTag(&local_f0,(QString *)&local_258,(QString *)&local_50);
      XmlOutput::operator<<(pXVar6,&local_f0);
      XmlOutput::xml_output::~xml_output(&local_f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_258);
      XmlOutput::xml_output::~xml_output(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
      QString::QString((QString *)&local_208,"Import");
      tag((xml_output *)&xmlFilter,(QString *)&local_208);
      pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
      QString::QString((QString *)&local_258,"Project");
      QString::QString((QString *)&local_50,"$(UserRootDir)\\Microsoft.Cpp.$(Platform).user.props");
      attributeTag(&local_a0,(QString *)&local_258,(QString *)&local_50);
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
      QString::QString((QString *)&local_68,"Condition");
      QString::QString((QString *)&local_b8,
                       "exists(\'$(UserRootDir)\\Microsoft.Cpp.$(Platform).user.props\')");
      attributeTag(&local_f0,(QString *)&local_68,(QString *)&local_b8);
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_f0);
      closetag();
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_168);
      closetag();
      XmlOutput::operator<<(pXVar6,&local_1a0);
      XmlOutput::xml_output::~xml_output(&local_1a0);
      XmlOutput::xml_output::~xml_output(&local_168);
      XmlOutput::xml_output::~xml_output(&local_f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      XmlOutput::xml_output::~xml_output(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_258);
      XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      lVar10 = lVar10 + 0x3a10;
    }
    QString::QString((QString *)&local_168,"PropertyGroup");
    tag((xml_output *)&xmlFilter,(QString *)&local_168);
    pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    QString::QString((QString *)&local_1a0,"Label");
    QString::QString((QString *)&local_208,"UserMacros");
    attributeTag(&local_a0,(QString *)&local_1a0,(QString *)&local_208);
    pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
    closetag();
    XmlOutput::operator<<(pXVar6,&local_f0);
    XmlOutput::xml_output::~xml_output(&local_f0);
    XmlOutput::xml_output::~xml_output(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    QString::QString((QString *)&local_a0,"PropertyGroup");
    tag((xml_output *)&xmlFilter,(QString *)&local_a0);
    XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    lVar10 = 0;
    for (uVar8 = 0; uVar8 < *(ulong *)((long)__buf + 0x100); uVar8 = uVar8 + 1) {
      lVar2 = *(long *)((long)__buf + 0xf8);
      local_168.xo_text.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_168.xo_type = 0xaaaaaaaa;
      local_168._4_4_ = 0xaaaaaaaa;
      local_168.xo_text.d.d._0_4_ = 0xaaaaaaaa;
      local_168.xo_text.d.d._4_4_ = 0xaaaaaaaa;
      generateCondition((QString *)&local_168,(VCConfiguration *)(lVar10 + lVar2 + 0xc0));
      if (*(long *)(lVar10 + lVar2 + 0x160) != 0) {
        QString::QString((QString *)&local_1a0,"OutDir");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        valueTag(&local_f0,(QString *)(lVar10 + lVar2 + 0x150));
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      if (*(long *)(lVar2 + 0x118 + lVar10) != 0) {
        QString::QString((QString *)&local_1a0,"IntDir");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        valueTag(&local_f0,(QString *)(lVar10 + lVar2 + 0x108));
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      if (*(long *)(lVar2 + 0x178 + lVar10) != 0) {
        QString::QString((QString *)&local_1a0,"TargetName");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        valueTag(&local_f0,(QString *)(lVar10 + lVar2 + 0x168));
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      if (*(long *)(lVar2 + 400 + lVar10) != 0) {
        QString::QString((QString *)&local_1a0,"TargetExt");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        valueTag(&local_f0,(QString *)(lVar10 + lVar2 + 0x180));
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      if (*(int *)(lVar2 + 0x62c + lVar10) != -1) {
        QString::QString((QString *)&local_1a0,"IgnoreImportLibrary");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        valueTagT(&local_f0,*(triState *)(lVar2 + 0x62c + lVar10));
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      iVar1 = *(int *)(lVar2 + 0x658 + lVar10);
      if (iVar1 != 0) {
        QString::QString((QString *)&local_1a0,"LinkIncremental");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        valueTagT(&local_f0,(uint)(iVar1 == 2));
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      tVar5 = *(triState *)(lVar2 + 0x7d8 + lVar10);
      if (tVar5 != unset) {
        QString::QString((QString *)&local_1a0,"GenerateManifest");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        valueTagT(&local_f0,tVar5);
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      if (*(int *)(lVar2 + 0xcf8 + lVar10) != -1) {
        QString::QString((QString *)&local_1a0,"PreBuildEventUseInBuild");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        tVar5 = operator!((triState *)(lVar10 + lVar2 + 0xcf8));
        valueTagT(&local_f0,tVar5);
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      if (*(int *)(lVar2 + 0xdd0 + lVar10) != -1) {
        QString::QString((QString *)&local_1a0,"PreLinkEventUseInBuild");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        tVar5 = operator!((triState *)(lVar10 + lVar2 + 0xdd0));
        valueTagT(&local_f0,tVar5);
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      if (*(int *)(lVar2 + 0xc70 + lVar10) != -1) {
        QString::QString((QString *)&local_1a0,"PostBuildEventUseInBuild");
        tag((xml_output *)&xmlFilter,(QString *)&local_1a0);
        pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
        QString::QString((QString *)&local_208,"Condition");
        attributeTag(&local_a0,(QString *)&local_208,(QString *)&local_168);
        pXVar6 = XmlOutput::operator<<(pXVar6,&local_a0);
        tVar5 = operator!((triState *)(lVar10 + lVar2 + 0xc70));
        valueTagT(&local_f0,tVar5);
        XmlOutput::operator<<(pXVar6,&local_f0);
        XmlOutput::xml_output::~xml_output(&local_f0);
        XmlOutput::xml_output::~xml_output(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
        XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
      lVar10 = lVar10 + 0x3a10;
    }
    closetag();
    XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
    XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
    lVar10 = 0;
    for (uVar8 = 0; uVar8 < *(ulong *)((long)__buf + 0x100); uVar8 = uVar8 + 1) {
      lVar2 = *(long *)((long)__buf + 0xf8);
      QString::QString((QString *)&local_f0,"ItemDefinitionGroup");
      tag((xml_output *)&xmlFilter,(QString *)&local_f0);
      pXVar6 = XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
      QString::QString((QString *)&local_168,"Condition");
      generateCondition((QString *)&local_1a0,(VCConfiguration *)(lVar2 + lVar10 + 0xc0));
      attributeTag(&local_a0,(QString *)&local_168,(QString *)&local_1a0);
      XmlOutput::operator<<(pXVar6,&local_a0);
      XmlOutput::xml_output::~xml_output(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
      XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
      (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[4])(this,pXVar9,lVar2 + lVar10 + 0x1d8);
      pp_Var3 = (this->super_VCProjectWriter)._vptr_VCProjectWriter;
      if (*(int *)(lVar2 + lVar10 + 0xd4) == 4) {
        (*pp_Var3[9])(this,pXVar9,lVar2 + lVar10 + 0x928);
      }
      else {
        (*pp_Var3[5])(this,pXVar9,lVar2 + lVar10 + 0x4f8);
      }
      (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[7])(this,pXVar9,lVar2 + lVar10 + 0xa10);
      (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[10])(this,pXVar9,lVar2 + lVar10 + 0xe20)
      ;
      if (*(int *)(lVar2 + lVar10 + 0xc70) != -1) {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                  (this,pXVar9,lVar2 + lVar10 + 0xc38);
      }
      if (*(int *)(lVar2 + 0xcf8 + lVar10) != -1) {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                  (this,pXVar9,lVar2 + lVar10 + 0xcc0);
      }
      if (*(int *)(lVar2 + 0xdd0 + lVar10) != -1) {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xb])
                  (this,pXVar9,lVar2 + lVar10 + 0xd98);
      }
      closetag();
      XmlOutput::operator<<(pXVar9,(xml_output *)&xmlFilter);
      XmlOutput::xml_output::~xml_output((xml_output *)&xmlFilter);
      if (*(char *)(lVar2 + 0xf10 + lVar10) == '\0') {
        (*(this->super_VCProjectWriter)._vptr_VCProjectWriter[0xd])
                  (this,pXVar9,lVar2 + lVar10 + 0xed8);
      }
      lVar10 = lVar10 + 0x3a10;
    }
    local_108.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_108.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_108);
    QFile::fileName();
    QString::append((QString *)&xmlFilter,".filters");
    QFile::setFileName((QString *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&xmlFilter);
    cVar4 = QFile::open(&local_108,0x1a);
    if (cVar4 == '\0') {
      warn_msg(WarnLogic,"Cannot open output filter file");
    }
    else {
      local_128.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_128.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_128,(QIODevice *)&local_108);
      xmlFilter.tagStack.super_QList<QString>.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      xmlFilter.tagStack.super_QList<QString>.d.size = -0x5555555555555556;
      xmlFilter.format = 0xaaaaaaaa;
      xmlFilter.conversion = 0xaaaaaaaa;
      xmlFilter.tagStack.super_QList<QString>.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      xmlFilter.currentIndent.d.size = -0x5555555555555556;
      xmlFilter.currentLevel = -0x55555556;
      xmlFilter.currentState = 0xaaaaaaaa;
      xmlFilter.currentIndent.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      xmlFilter.currentIndent.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      xmlFilter.indent.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      xmlFilter.indent.d.size = -0x5555555555555556;
      xmlFilter.xmlFile = (QTextStream *)0xaaaaaaaaaaaaaaaa;
      xmlFilter.indent.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      lVar10 = 0;
      XmlOutput::XmlOutput(&xmlFilter,(QTextStream *)&local_128,NoConversion);
      QString::QString((QString *)&local_a0,"  ");
      XmlOutput::setIndentString(&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_208,"1.0");
      QString::QString((QString *)&local_258,"utf-8");
      declaration(&local_a0,(QString *)&local_208,(QString *)&local_258);
      pXVar6 = XmlOutput::operator<<(&xmlFilter,&local_a0);
      QString::QString((QString *)&local_50,"Project");
      tag(&local_f0,(QString *)&local_50);
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_f0);
      iVar7 = QList<VCProjectSingleConfig>::begin
                        ((QList<VCProjectSingleConfig> *)((long)__buf + 0xf0));
      attrTagToolsVersion(&local_168,&(iVar7.i)->Configuration);
      pXVar6 = XmlOutput::operator<<(pXVar6,&local_168);
      QString::QString((QString *)&local_68,"xmlns");
      QString::QString((QString *)&local_b8,"http://schemas.microsoft.com/developer/msbuild/2003");
      attributeTag(&local_1a0,(QString *)&local_68,(QString *)&local_b8);
      XmlOutput::operator<<(pXVar6,&local_1a0);
      XmlOutput::xml_output::~xml_output(&local_1a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      XmlOutput::xml_output::~xml_output(&local_168);
      XmlOutput::xml_output::~xml_output(&local_f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      XmlOutput::xml_output::~xml_output(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_258);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      QString::QString((QString *)&local_f0,"ItemGroup");
      tag(&local_a0,(QString *)&local_f0);
      XmlOutput::operator<<(&xmlFilter,&local_a0);
      XmlOutput::xml_output::~xml_output(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f0);
      QString::QString((QString *)&local_a0,"Form Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Generated Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Header Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"LexYacc Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Resource Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Source Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Translation Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Deployment Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Distribution Files");
      addFilters((VCProject *)__buf,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      for (uVar8 = 0; uVar8 < *(ulong *)((long)__buf + 0x118); uVar8 = uVar8 + 1) {
        addFilters((VCProject *)__buf,&xmlFilter,
                   (QString *)(*(long *)((long)__buf + 0x110) + lVar10));
        lVar10 = lVar10 + 0x18;
      }
      closetag();
      XmlOutput::operator<<(&xmlFilter,&local_a0);
      XmlOutput::xml_output::~xml_output(&local_a0);
      QString::QString((QString *)&local_a0,"Source Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Header Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Generated Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"LexYacc Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Translation Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Form Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Resource Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Deployment Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_a0,"Distribution Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      lVar10 = 0;
      for (uVar8 = 0; uVar8 < *(ulong *)((long)__buf + 0x118); uVar8 = uVar8 + 1) {
        outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,
                     (QString *)(*(long *)((long)__buf + 0x110) + lVar10));
        lVar10 = lVar10 + 0x18;
      }
      QString::QString((QString *)&local_a0,"Root Files");
      outputFilter((VCProject *)__buf,pXVar9,&xmlFilter,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
      QString::QString((QString *)&local_208,"Project");
      QString::QString((QString *)&local_258,"$(VCTargetsPath)\\Microsoft.Cpp.targets");
      import(&local_a0,(QString *)&local_208,(QString *)&local_258);
      pXVar9 = XmlOutput::operator<<(pXVar9,&local_a0);
      QString::QString((QString *)&local_50,"ImportGroup");
      tag(&local_f0,(QString *)&local_50);
      pXVar9 = XmlOutput::operator<<(pXVar9,&local_f0);
      QString::QString((QString *)&local_68,"Label");
      QString::QString((QString *)&local_b8,"ExtensionTargets");
      attributeTag(&local_168,(QString *)&local_68,(QString *)&local_b8);
      pXVar9 = XmlOutput::operator<<(pXVar9,&local_168);
      closetag();
      XmlOutput::operator<<(pXVar9,&local_1a0);
      XmlOutput::xml_output::~xml_output(&local_1a0);
      XmlOutput::xml_output::~xml_output(&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      XmlOutput::xml_output::~xml_output(&local_f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      XmlOutput::xml_output::~xml_output(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_258);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
      XmlOutput::~XmlOutput(&xmlFilter);
      QTextStream::~QTextStream((QTextStream *)&local_128);
    }
    QFile::~QFile((QFile *)&local_108);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, VCProject &tool)
{
    if (tool.SingleProjects.size() == 0) {
        warn_msg(WarnLogic, "Generator: .NET: no single project in merge project, no output");
        return;
    }

    xml.setIndentString("  ");

    xml << decl("1.0", "utf-8")
        << tag("Project")
        << attrTag("DefaultTargets","Build")
        << attrTagToolsVersion(tool.SingleProjects.first().Configuration)
        << attrTag("xmlns", "http://schemas.microsoft.com/developer/msbuild/2003")
        << tag("ItemGroup")
        << attrTag("Label", "ProjectConfigurations");

    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        xml << tag("ProjectConfiguration")
            << attrTag("Include" , tool.SingleProjects.at(i).Configuration.Name)
            << tagValue("Configuration", tool.SingleProjects.at(i).Configuration.ConfigurationName)
            << tagValue("Platform", tool.SingleProjects.at(i).PlatformName)
            << closetag();
    }

    xml << closetag()
        << tag("PropertyGroup")
        << attrTag("Label", "Globals")
        << tagValue("ProjectGuid", tool.ProjectGUID)
        << tagValue("RootNamespace", tool.Name)
        << tagValue("Keyword", tool.Keyword);

    if (!tool.WindowsTargetPlatformVersion.isEmpty())
        xml << tagValue("WindowsTargetPlatformVersion", tool.WindowsTargetPlatformVersion);
    if (!tool.WindowsTargetPlatformMinVersion.isEmpty())
        xml << tagValue("WindowsTargetPlatformMinVersion", tool.WindowsTargetPlatformMinVersion);

    xml << closetag();

    // config part.
    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.Default.props");
    for (int i = 0; i < tool.SingleProjects.size(); ++i)
        write(xml, tool.SingleProjects.at(i).Configuration);
    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.props");

    // Extension settings
    xml << tag("ImportGroup")
        << attrTag("Label", "ExtensionSettings")
        << closetag();

    // PropertySheets
    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        xml << tag("ImportGroup")
            << attrTag("Condition", generateCondition(tool.SingleProjects.at(i).Configuration))
            << attrTag("Label", "PropertySheets");

        xml << tag("Import")
            << attrTag("Project", "$(UserRootDir)\\Microsoft.Cpp.$(Platform).user.props")
            << attrTag("Condition", "exists('$(UserRootDir)\\Microsoft.Cpp.$(Platform).user.props')")
            << closetag()
            << closetag();
    }

    // UserMacros
    xml << tag("PropertyGroup")
        << attrTag("Label", "UserMacros")
        << closetag();

    xml << tag("PropertyGroup");
    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        const VCConfiguration &config = tool.SingleProjects.at(i).Configuration;
        const QString condition = generateCondition(config);

        if (!config.OutputDirectory.isEmpty()) {
            xml << tag("OutDir")
                << attrTag("Condition", condition)
                << valueTag(config.OutputDirectory);
        }
        if (!config.IntermediateDirectory.isEmpty()) {
            xml << tag("IntDir")
                << attrTag("Condition", condition)
                << valueTag(config.IntermediateDirectory);
        }
        if (!config.PrimaryOutput.isEmpty()) {
            xml << tag("TargetName")
                << attrTag("Condition", condition)
                << valueTag(config.PrimaryOutput);
        }
        if (!config.PrimaryOutputExtension.isEmpty()) {
            xml << tag("TargetExt")
                << attrTag("Condition", condition)
                << valueTag(config.PrimaryOutputExtension);
        }
        if (config.linker.IgnoreImportLibrary != unset) {
            xml << tag("IgnoreImportLibrary")
                << attrTag("Condition", condition)
                << valueTagT(config.linker.IgnoreImportLibrary);
        }

        if (config.linker.LinkIncremental != linkIncrementalDefault) {
            const triState ts = (config.linker.LinkIncremental == linkIncrementalYes ? _True : _False);
            xml << tag("LinkIncremental")
                << attrTag("Condition", condition)
                << valueTagT(ts);
        }

        const triState generateManifest = config.linker.GenerateManifest;
        if (generateManifest != unset) {
            xml << tag("GenerateManifest")
                << attrTag("Condition", condition)
                << valueTagT(generateManifest);
        }

        if (config.preBuild.ExcludedFromBuild != unset)
        {
            xml << tag("PreBuildEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.preBuild.ExcludedFromBuild);
        }

        if (config.preLink.ExcludedFromBuild != unset)
        {
            xml << tag("PreLinkEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.preLink.ExcludedFromBuild);
        }

        if (config.postBuild.ExcludedFromBuild != unset)
        {
            xml << tag("PostBuildEventUseInBuild")
                << attrTag("Condition", condition)
                << valueTagT(!config.postBuild.ExcludedFromBuild);
        }
    }
    xml << closetag();

    for (int i = 0; i < tool.SingleProjects.size(); ++i) {
        const VCConfiguration &config = tool.SingleProjects.at(i).Configuration;

        xml << tag("ItemDefinitionGroup")
            << attrTag("Condition", generateCondition(config));

        // ClCompile
        write(xml, config.compiler);

        // Librarian / Linker
        if (config.ConfigurationType == typeStaticLibrary)
            write(xml, config.librarian);
        else
            write(xml, config.linker);

        // Midl
        write(xml, config.idl);

        // ResourceCompiler
        write(xml, config.resource);

        // Post build event
        if (config.postBuild.ExcludedFromBuild != unset)
            write(xml, config.postBuild);

        // Pre build event
        if (config.preBuild.ExcludedFromBuild != unset)
            write(xml, config.preBuild);

        // Pre link event
        if (config.preLink.ExcludedFromBuild != unset)
            write(xml, config.preLink);

        xml << closetag();

        // windeployqt
        if (!config.windeployqt.ExcludedFromBuild)
            write(xml, config.windeployqt);
    }

    // The file filters are added in a separate file for MSBUILD.
    QFile filterFile;
    filterFile.setFileName(Option::output.fileName().append(".filters"));
    if (!filterFile.open(QIODevice::WriteOnly | QIODevice::Text | QIODevice::Truncate)) {
        warn_msg(WarnLogic, "Cannot open output filter file");
        return;
    }
    QTextStream ts(&filterFile);
    XmlOutput xmlFilter(ts, XmlOutput::NoConversion);

    xmlFilter.setIndentString("  ");

    xmlFilter << decl("1.0", "utf-8")
              << tag("Project")
              << attrTagToolsVersion(tool.SingleProjects.first().Configuration)
              << attrTag("xmlns", "http://schemas.microsoft.com/developer/msbuild/2003");

    xmlFilter << tag("ItemGroup");

    addFilters(tool, xmlFilter, "Form Files");
    addFilters(tool, xmlFilter, "Generated Files");
    addFilters(tool, xmlFilter, "Header Files");
    addFilters(tool, xmlFilter, "LexYacc Files");
    addFilters(tool, xmlFilter, "Resource Files");
    addFilters(tool, xmlFilter, "Source Files");
    addFilters(tool, xmlFilter, "Translation Files");
    addFilters(tool, xmlFilter, "Deployment Files");
    addFilters(tool, xmlFilter, "Distribution Files");

    for (int x = 0; x < tool.ExtraCompilers.size(); ++x)
        addFilters(tool, xmlFilter, tool.ExtraCompilers.at(x));

    xmlFilter << closetag();

    outputFilter(tool, xml, xmlFilter, "Source Files");
    outputFilter(tool, xml, xmlFilter, "Header Files");
    outputFilter(tool, xml, xmlFilter, "Generated Files");
    outputFilter(tool, xml, xmlFilter, "LexYacc Files");
    outputFilter(tool, xml, xmlFilter, "Translation Files");
    outputFilter(tool, xml, xmlFilter, "Form Files");
    outputFilter(tool, xml, xmlFilter, "Resource Files");
    outputFilter(tool, xml, xmlFilter, "Deployment Files");
    outputFilter(tool, xml, xmlFilter, "Distribution Files");
    for (int x = 0; x < tool.ExtraCompilers.size(); ++x) {
        outputFilter(tool, xml, xmlFilter, tool.ExtraCompilers.at(x));
    }
    outputFilter(tool, xml, xmlFilter, "Root Files");

    xml << import("Project", "$(VCTargetsPath)\\Microsoft.Cpp.targets")
        << tag("ImportGroup")
        << attrTag("Label", "ExtensionTargets")
        << closetag();
}